

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonString *p;
  sqlite3_context *in_RDI;
  JsonString *pStr;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  
  p = (JsonString *)
      sqlite3_aggregate_context
                ((sqlite3_context *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0)
  ;
  if (p != (JsonString *)0x0) {
    if (p->zBuf == (char *)0x0) {
      jsonStringInit(p,(sqlite3_context *)
                       CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      jsonAppendChar(p,in_stack_ffffffffffffffdf);
    }
    else if (1 < p->nUsed) {
      jsonAppendChar(p,in_stack_ffffffffffffffdf);
    }
    p->pCtx = in_RDI;
    jsonAppendSqlValue((JsonString *)argv,(sqlite3_value *)pStr);
  }
  return;
}

Assistant:

static void jsonArrayStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonStringInit(pStr, ctx);
      jsonAppendChar(pStr, '[');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    jsonAppendSqlValue(pStr, argv[0]);
  }
}